

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

void uv__fs_scandir_cleanup(uv_fs_t *req)

{
  ulong uVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = req->result;
  if (-1 < (long)uVar1) {
    uVar3 = req->nbufs - 1;
    if (req->nbufs == 0) {
      uVar3 = 0;
    }
    if (uVar3 < (uint)uVar1) {
      pvVar2 = req->ptr;
      uVar4 = (ulong)uVar3;
      do {
        free(*(void **)((long)pvVar2 + uVar4 * 8));
        uVar4 = uVar4 + 1;
      } while (uVar4 < (uVar1 & 0xffffffff));
    }
  }
  free(req->ptr);
  req->ptr = (void *)0x0;
  return;
}

Assistant:

void uv__fs_scandir_cleanup(uv_fs_t* req) {
  uv__dirent_t** dents;
  unsigned int* nbufs;
  unsigned int i;
  unsigned int n;

  if (req->result >= 0) {
    dents = req->ptr;
    nbufs = uv__get_nbufs(req);

    i = 0;
    if (*nbufs > 0)
      i = *nbufs - 1;

    n = (unsigned int) req->result;
    for (; i < n; i++)
      uv__fs_scandir_free(dents[i]);
  }

  uv__fs_scandir_free(req->ptr);
  req->ptr = NULL;
}